

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

ModuleLayoutSection
spvtools::val::anon_unknown_11::InstructionLayoutSection(ModuleLayoutSection current_section,Op op)

{
  int32_t iVar1;
  ModuleLayoutSection MVar2;
  
  iVar1 = spvOpcodeGeneratesType(op);
  MVar2 = kLayoutTypes;
  if (iVar1 != 0) {
    return kLayoutTypes;
  }
  iVar1 = spvOpcodeIsConstant(op);
  if (iVar1 != 0) {
    return kLayoutTypes;
  }
  if (0x46 < (int)op) {
    if ((int)op < 0x14b) {
      if (op - OpDecorate < 5) {
        return kLayoutAnnotations;
      }
      if (op != OpNoLine) {
        if (op == OpModuleProcessed) {
          return kLayoutDebug3;
        }
        goto switchD_00301aee_caseD_9;
      }
    }
    else if ((int)op < 0x1151) {
      if (op == OpExecutionModeId) goto switchD_00301aee_caseD_10;
      if (op == OpDecorateId) {
        return kLayoutAnnotations;
      }
      if (op != OpUntypedVariableKHR) goto switchD_00301aee_caseD_9;
    }
    else {
      if (op - OpDecorateString < 2) {
        return kLayoutAnnotations;
      }
      if (op != OpExtInstWithForwardRefsKHR) {
        if (op == OpSamplerImageAddressingModeNV) {
          return kLayoutSamplerImageAddressMode;
        }
        goto switchD_00301aee_caseD_9;
      }
    }
    goto switchD_00301aee_caseD_1;
  }
  switch(op) {
  case OpSourceContinued:
  case OpSource:
  case OpSourceExtension:
  case OpString:
    MVar2 = kLayoutDebug1;
    break;
  case OpName:
  case OpMemberName:
    MVar2 = kLayoutDebug2;
    break;
  case OpLine|OpUndef:
  case OpExtInst|OpUndef:
  case OpExecutionMode|OpSourceContinued:
  case OpTypeVoid:
  case OpTypeBool:
  case OpTypeInt:
  case OpTypeFloat:
  case OpTypeVector:
  case OpTypeMatrix:
  case OpTypeImage:
  case OpTypeSampler:
  case OpTypeSampledImage:
  case OpTypeArray:
  case OpTypeRuntimeArray:
  case OpTypeStruct:
  case OpTypeOpaque:
  case OpTypePointer:
  case OpTypeFunction:
  case OpTypeEvent:
  case OpTypeDeviceEvent:
  case OpTypeReserveId:
  case OpTypeQueue:
  case OpTypePipe:
switchD_00301aee_caseD_9:
    MVar2 = kLayoutFunctionDefinitions;
    break;
  case OpExtension:
    MVar2 = kLayoutExtensions;
    break;
  case OpExtInstImport:
    MVar2 = kLayoutExtInstImport;
    break;
  case OpMemoryModel:
    MVar2 = kLayoutMemoryModel;
    break;
  case OpEntryPoint:
    MVar2 = kLayoutEntryPoint;
    break;
  case OpExecutionMode:
switchD_00301aee_caseD_10:
    MVar2 = kLayoutExecutionMode;
    break;
  case OpCapability:
    MVar2 = kLayoutCapabilities;
    break;
  case OpTypeForwardPointer:
    break;
  default:
    if (op - OpFunction < 3) {
      return current_section == kLayoutFunctionDeclarations ^ kLayoutFunctionDefinitions;
    }
    if (op != OpVariable) goto switchD_00301aee_caseD_9;
  case OpUndef:
  case OpLine:
  case OpExtInst:
switchD_00301aee_caseD_1:
    MVar2 = (uint)(current_section != kLayoutTypes) * 2 + kLayoutTypes;
  }
  return MVar2;
}

Assistant:

ModuleLayoutSection InstructionLayoutSection(
    ModuleLayoutSection current_section, spv::Op op) {
  // See Section 2.4
  if (spvOpcodeGeneratesType(op) || spvOpcodeIsConstant(op))
    return kLayoutTypes;

  switch (op) {
    case spv::Op::OpCapability:
      return kLayoutCapabilities;
    case spv::Op::OpExtension:
      return kLayoutExtensions;
    case spv::Op::OpExtInstImport:
      return kLayoutExtInstImport;
    case spv::Op::OpMemoryModel:
      return kLayoutMemoryModel;
    case spv::Op::OpEntryPoint:
      return kLayoutEntryPoint;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      return kLayoutExecutionMode;
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSource:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
      return kLayoutDebug1;
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
      return kLayoutDebug2;
    case spv::Op::OpModuleProcessed:
      return kLayoutDebug3;
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpDecorationGroup:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
      return kLayoutAnnotations;
    case spv::Op::OpTypeForwardPointer:
      return kLayoutTypes;
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpExtInst:
    case spv::Op::OpExtInstWithForwardRefsKHR:
      // spv::Op::OpExtInst is only allowed in types section for certain
      // extended instruction sets. This will be checked separately.
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    case spv::Op::OpUndef:
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpFunction:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpFunctionEnd:
      if (current_section == kLayoutFunctionDeclarations)
        return kLayoutFunctionDeclarations;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpSamplerImageAddressingModeNV:
      return kLayoutSamplerImageAddressMode;
    default:
      break;
  }
  return kLayoutFunctionDefinitions;
}